

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

Kit_DsdObj_t * Kit_DsdObjAlloc(Kit_DsdNtk_t *pNtk,Kit_Dsd_t Type,int nFans)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  Kit_DsdObj_t *__s;
  Kit_DsdObj_t **local_38;
  int nSize;
  Kit_DsdObj_t *pObj;
  int nFans_local;
  Kit_Dsd_t Type_local;
  Kit_DsdNtk_t *pNtk_local;
  
  uVar2 = Kit_DsdObjOffset(nFans);
  iVar3 = Kit_TruthWordNum(nFans);
  iVar3 = (uVar2 + (uint)(Type == KIT_DSD_PRIME) * iVar3) * 4 + 4;
  __s = (Kit_DsdObj_t *)malloc((long)iVar3);
  memset(__s,0,(long)iVar3);
  *__s = (Kit_DsdObj_t)((uint)*__s & 0xffffffc0 | (uint)pNtk->nVars + (uint)pNtk->nNodes & 0x3f);
  *__s = (Kit_DsdObj_t)((uint)*__s & 0xfffffe3f | (Type & (KIT_DSD_XOR|KIT_DSD_AND)) << 6);
  *__s = (Kit_DsdObj_t)((uint)*__s & 0x3ffffff | nFans << 0x1a);
  uVar2 = Kit_DsdObjOffset(nFans);
  *__s = (Kit_DsdObj_t)((uint)*__s & 0xfffc03ff | (uVar2 & 0xff) << 10);
  if (pNtk->nNodes == pNtk->nNodesAlloc) {
    pNtk->nNodesAlloc = pNtk->nNodesAlloc << 1;
    if (pNtk->pNodes == (Kit_DsdObj_t **)0x0) {
      local_38 = (Kit_DsdObj_t **)malloc((ulong)pNtk->nNodesAlloc << 3);
    }
    else {
      local_38 = (Kit_DsdObj_t **)realloc(pNtk->pNodes,(ulong)pNtk->nNodesAlloc << 3);
    }
    pNtk->pNodes = local_38;
  }
  if (pNtk->nNodes < pNtk->nNodesAlloc) {
    uVar1 = pNtk->nNodes;
    pNtk->nNodes = uVar1 + 1;
    pNtk->pNodes[uVar1] = __s;
    return __s;
  }
  __assert_fail("pNtk->nNodes < pNtk->nNodesAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                ,0x6d,"Kit_DsdObj_t *Kit_DsdObjAlloc(Kit_DsdNtk_t *, Kit_Dsd_t, int)");
}

Assistant:

Kit_DsdObj_t * Kit_DsdObjAlloc( Kit_DsdNtk_t * pNtk, Kit_Dsd_t Type, int nFans )
{
    Kit_DsdObj_t * pObj;
    int nSize = sizeof(Kit_DsdObj_t) + sizeof(unsigned) * (Kit_DsdObjOffset(nFans) + (Type == KIT_DSD_PRIME) * Kit_TruthWordNum(nFans));
    pObj = (Kit_DsdObj_t *)ABC_ALLOC( char, nSize );
    memset( pObj, 0, (size_t)nSize );
    pObj->Id = pNtk->nVars + pNtk->nNodes;
    pObj->Type = Type;
    pObj->nFans = nFans;
    pObj->Offset = Kit_DsdObjOffset( nFans );
    // add the object
    if ( pNtk->nNodes == pNtk->nNodesAlloc )
    {
        pNtk->nNodesAlloc *= 2;
        pNtk->pNodes = ABC_REALLOC( Kit_DsdObj_t *, pNtk->pNodes, pNtk->nNodesAlloc ); 
    }
    assert( pNtk->nNodes < pNtk->nNodesAlloc );
    pNtk->pNodes[pNtk->nNodes++] = pObj;
    return pObj;
}